

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgnxk(fitsfile *fptr,char **inclist,int ninc,char **exclist,int nexc,char *card,int *status)

{
  int iVar1;
  char local_108 [8];
  char keyname [75];
  char keybuf [81];
  long jj;
  long ii;
  int namelen;
  int exact;
  int match;
  int casesn;
  char *card_local;
  char **ppcStack_30;
  int nexc_local;
  char **exclist_local;
  char **ppcStack_20;
  int ninc_local;
  char **inclist_local;
  fitsfile *fptr_local;
  
  *card = '\0';
  if (*status < 1) {
    exact = 0;
    _match = card;
    card_local._4_4_ = nexc;
    ppcStack_30 = exclist;
    exclist_local._4_4_ = ninc;
    ppcStack_20 = inclist;
    inclist_local = (char **)fptr;
    while (iVar1 = ffgcrd((fitsfile *)inclist_local,"*",keyname + 0x48,status), iVar1 < 1) {
      ffgknm(keyname + 0x48,local_108,(int *)&ii,status);
      for (jj = 0; jj < exclist_local._4_4_; jj = jj + 1) {
        ffcmps(ppcStack_20[jj],local_108,exact,&namelen,(int *)((long)&ii + 4));
        if (namelen != 0) {
          stack0xffffffffffffffa0 = -1;
          do {
            register0x00000000 = stack0xffffffffffffffa0 + 1;
            if (card_local._4_4_ <= register0x00000000) break;
            ffcmps(ppcStack_30[register0x00000000],local_108,exact,&namelen,(int *)((long)&ii + 4));
          } while (namelen == 0);
          if (card_local._4_4_ <= register0x00000000) {
            strcat(_match,keyname + 0x48);
            return *status;
          }
        }
      }
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgnxk( fitsfile *fptr,     /* I - FITS file pointer              */
            char **inclist,     /* I - list of included keyword names */
            int ninc,           /* I - number of names in inclist     */
            char **exclist,     /* I - list of excluded keyword names */
            int nexc,           /* I - number of names in exclist     */
            char *card,         /* O - first matching keyword         */
            int  *status)       /* IO - error status                  */
/*
    Return the next keyword that matches one of the names in inclist
    but does not match any of the names in exclist.  The search
    goes from the current position to the end of the header, only.
    Wild card characters may be used in the name lists ('*', '?' and '#').
*/
{
    int casesn, match, exact, namelen;
    long ii, jj;
    char keybuf[FLEN_CARD], keyname[FLEN_KEYWORD];

    card[0] = '\0';
    if (*status > 0)
        return(*status);

    casesn = FALSE;

    /* get next card, and return with an error if hit end of header */
    while( ffgcrd(fptr, "*", keybuf, status) <= 0)
    {
        ffgknm(keybuf, keyname, &namelen, status); /* get the keyword name */
        
        /* does keyword match any names in the include list? */
        for (ii = 0; ii < ninc; ii++)
        {
            ffcmps(inclist[ii], keyname, casesn, &match, &exact);
            if (match)
            {
                /* does keyword match any names in the exclusion list? */
                jj = -1;
                while ( ++jj < nexc )
                {
                    ffcmps(exclist[jj], keyname, casesn, &match, &exact);
                    if (match)
                        break;
                }

                if (jj >= nexc)
                {
                    /* not in exclusion list, so return this keyword */
                    strcat(card, keybuf);
                    return(*status);
                }
            }
        }
    }
    return(*status);
}